

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_utils.cc
# Opt level: O1

string * __thiscall
RigidBodyDynamics::Utils::GetModelHierarchy_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,Model *model)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_R8D;
  stringstream result;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  paVar1 = &local_1c0.field_2;
  local_1c0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  std::__cxx11::stringstream::stringstream(local_1a0,(string *)&local_1c0,_S_out|_S_in);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  print_hierarchy_abi_cxx11_(&local_1c0,this,(Model *)0x0,0,in_R8D);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

RBDL_DLLAPI std::string GetModelHierarchy (const Model &model)
{
  stringstream result ("");

  result << print_hierarchy (model);

  return result.str();
}